

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  double dVar1;
  timeval tVar2;
  __time_t local_38;
  __suseconds_t local_30;
  __time_t local_28;
  timeval now;
  timerid timer_local;
  Curl_easy *data_local;
  
  tVar2 = curlx_tvnow();
  local_28 = tVar2.tv_sec;
  now.tv_sec = tVar2.tv_usec;
  switch(timer) {
  default:
    break;
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = local_28;
    (data->progress).t_startop.tv_usec = now.tv_sec;
    break;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = local_28;
    (data->progress).t_startsingle.tv_usec = now.tv_sec;
    break;
  case TIMER_NAMELOOKUP:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).t_startsingle);
    (data->progress).t_nslookup = dVar1;
    break;
  case TIMER_CONNECT:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).t_startsingle);
    (data->progress).t_connect = dVar1;
    break;
  case TIMER_APPCONNECT:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).t_startsingle);
    (data->progress).t_appconnect = dVar1;
    break;
  case TIMER_PRETRANSFER:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).t_startsingle);
    (data->progress).t_pretransfer = dVar1;
    break;
  case TIMER_STARTTRANSFER:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).t_startsingle);
    (data->progress).t_starttransfer = dVar1;
    break;
  case TIMER_POSTRANSFER:
    break;
  case TIMER_STARTACCEPT:
    tVar2 = curlx_tvnow();
    local_38 = tVar2.tv_sec;
    (data->progress).t_acceptdata.tv_sec = local_38;
    local_30 = tVar2.tv_usec;
    (data->progress).t_acceptdata.tv_usec = local_30;
    break;
  case TIMER_REDIRECT:
    dVar1 = curlx_tvdiff_secs(tVar2,(data->progress).start);
    (data->progress).t_redirect = dVar1;
  }
  return;
}

Assistant:

void Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct timeval now = Curl_tvnow();

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    break;

  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = Curl_tvnow();
    break;

  case TIMER_NAMELOOKUP:
    data->progress.t_nslookup =
      Curl_tvdiff_secs(now, data->progress.t_startsingle);
    break;
  case TIMER_CONNECT:
    data->progress.t_connect =
      Curl_tvdiff_secs(now, data->progress.t_startsingle);
    break;
  case TIMER_APPCONNECT:
    data->progress.t_appconnect =
      Curl_tvdiff_secs(now, data->progress.t_startsingle);
    break;
  case TIMER_PRETRANSFER:
    data->progress.t_pretransfer =
      Curl_tvdiff_secs(now, data->progress.t_startsingle);
    break;
  case TIMER_STARTTRANSFER:
    data->progress.t_starttransfer =
      Curl_tvdiff_secs(now, data->progress.t_startsingle);
    break;
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_tvdiff_secs(now, data->progress.start);
    break;
  }
}